

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O3

void LoadFunction(LoadState *S,Proto *f)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  Instruction *b;
  TValue *pTVar4;
  Proto **ppPVar5;
  Proto *pPVar6;
  Upvaldesc *pUVar7;
  TString *pTVar8;
  int *b_00;
  LocVar *pLVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  char x_6;
  char x_7;
  char x_4;
  char x_3;
  char x;
  char x_1;
  char x_2;
  lua_Number x_5;
  lu_byte local_3f;
  lu_byte local_3e;
  char local_3d;
  byte local_3c;
  lu_byte local_3b;
  lu_byte local_3a;
  lu_byte local_39;
  undefined8 local_38;
  
  iVar2 = LoadInt(S);
  f->linedefined = iVar2;
  iVar2 = LoadInt(S);
  f->lastlinedefined = iVar2;
  LoadBlock(S,&local_3b,1);
  f->numparams = local_3b;
  LoadBlock(S,&local_3a,1);
  f->is_vararg = local_3a;
  LoadBlock(S,&local_39,1);
  f->maxstacksize = local_39;
  uVar3 = LoadInt(S);
  b = (Instruction *)luaM_realloc_(S->L,(void *)0x0,0,(ulong)uVar3 << 2);
  f->code = b;
  f->sizecode = uVar3;
  LoadBlock(S,b,(ulong)uVar3 << 2);
  uVar3 = LoadInt(S);
  uVar11 = (ulong)uVar3;
  sVar14 = uVar11 * 0x10;
  pTVar4 = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,sVar14);
  f->k = pTVar4;
  f->sizek = uVar3;
  auVar1 = _DAT_0011d020;
  if (uVar3 != 0) {
    lVar12 = uVar11 - 1;
    auVar15._8_4_ = (int)lVar12;
    auVar15._0_8_ = lVar12;
    auVar15._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar10 = 0;
    auVar15 = auVar15 ^ _DAT_0011d020;
    auVar20 = _DAT_0011d000;
    auVar19 = _DAT_0011d010;
    do {
      auVar21 = auVar19 ^ auVar1;
      iVar2 = auVar15._4_4_;
      if ((bool)(~(auVar21._4_4_ == iVar2 && auVar15._0_4_ < auVar21._0_4_ || iVar2 < auVar21._4_4_)
                & 1)) {
        *(undefined4 *)((long)&pTVar4->tt_ + uVar10) = 0;
      }
      if ((auVar21._12_4_ != auVar15._12_4_ || auVar21._8_4_ <= auVar15._8_4_) &&
          auVar21._12_4_ <= auVar15._12_4_) {
        *(undefined4 *)((long)&pTVar4[1].tt_ + uVar10) = 0;
      }
      auVar21 = auVar20 ^ auVar1;
      iVar22 = auVar21._4_4_;
      if (iVar22 <= iVar2 && (iVar22 != iVar2 || auVar21._0_4_ <= auVar15._0_4_)) {
        *(undefined4 *)((long)&pTVar4[2].tt_ + uVar10) = 0;
        *(undefined4 *)((long)&pTVar4[3].tt_ + uVar10) = 0;
      }
      lVar12 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar12 + 4;
      lVar12 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 4;
      auVar20._8_8_ = lVar12 + 4;
      uVar10 = uVar10 + 0x40;
    } while ((sVar14 + 0x30 & 0xffffffffffffffc0) != uVar10);
    if (uVar11 != 0) {
      sVar13 = 0;
      do {
        pTVar4 = f->k;
        LoadBlock(S,&local_3c,1);
        uVar3 = (uint)local_3c;
        switch(local_3c) {
        case 0:
          break;
        case 1:
          LoadBlock(S,&local_3d,1);
          *(int *)((long)&pTVar4->value_ + sVar13) = (int)local_3d;
          uVar3 = 1;
          break;
        default:
          goto switchD_0011156c_caseD_2;
        case 3:
          LoadBlock(S,&local_38,8);
          *(undefined8 *)((long)&pTVar4->value_ + sVar13) = local_38;
          uVar3 = 3;
          break;
        case 4:
          pTVar8 = LoadString(S);
          *(TString **)((long)&pTVar4->value_ + sVar13) = pTVar8;
          uVar3 = (pTVar8->tsv).tt | 0x40;
        }
        *(uint *)((long)&pTVar4->tt_ + sVar13) = uVar3;
switchD_0011156c_caseD_2:
        sVar13 = sVar13 + 0x10;
      } while (sVar14 != sVar13);
    }
  }
  uVar3 = LoadInt(S);
  uVar11 = (ulong)uVar3;
  ppPVar5 = (Proto **)luaM_realloc_(S->L,(void *)0x0,0,uVar11 * 8);
  f->p = ppPVar5;
  f->sizep = uVar3;
  if (uVar3 != 0) {
    uVar10 = 0;
    do {
      f->p[uVar10] = (Proto *)0x0;
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
    if (uVar11 != 0) {
      uVar10 = 0;
      do {
        pPVar6 = luaF_newproto(S->L);
        f->p[uVar10] = pPVar6;
        LoadFunction(S,f->p[uVar10]);
        uVar10 = uVar10 + 1;
      } while (uVar11 != uVar10);
    }
  }
  uVar3 = LoadInt(S);
  sVar14 = (ulong)uVar3 * 0x10;
  pUVar7 = (Upvaldesc *)luaM_realloc_(S->L,(void *)0x0,0,sVar14);
  f->upvalues = pUVar7;
  f->sizeupvalues = uVar3;
  auVar1 = _DAT_0011d020;
  if (uVar3 != 0) {
    lVar12 = (ulong)uVar3 - 1;
    auVar16._8_4_ = (int)lVar12;
    auVar16._0_8_ = lVar12;
    auVar16._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar11 = 0;
    auVar16 = auVar16 ^ _DAT_0011d020;
    auVar21 = _DAT_0011d010;
    do {
      auVar20 = auVar21 ^ auVar1;
      if ((bool)(~(auVar16._4_4_ < auVar20._4_4_ ||
                  auVar16._0_4_ < auVar20._0_4_ && auVar20._4_4_ == auVar16._4_4_) & 1)) {
        *(undefined8 *)((long)&pUVar7->name + uVar11) = 0;
      }
      if (auVar20._12_4_ <= auVar16._12_4_ &&
          (auVar20._8_4_ <= auVar16._8_4_ || auVar20._12_4_ != auVar16._12_4_)) {
        *(undefined8 *)((long)&pUVar7[1].name + uVar11) = 0;
      }
      lVar12 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 2;
      auVar21._8_8_ = lVar12 + 2;
      uVar11 = uVar11 + 0x20;
    } while ((sVar14 + 0x10 & 0xffffffffffffffe0) != uVar11);
    sVar13 = 0;
    do {
      LoadBlock(S,&local_3f,1);
      (&f->upvalues->instack)[sVar13] = local_3f;
      LoadBlock(S,&local_3e,1);
      (&f->upvalues->idx)[sVar13] = local_3e;
      sVar13 = sVar13 + 0x10;
    } while (sVar14 != sVar13);
  }
  pTVar8 = LoadString(S);
  f->source = pTVar8;
  uVar3 = LoadInt(S);
  b_00 = (int *)luaM_realloc_(S->L,(void *)0x0,0,(ulong)uVar3 << 2);
  f->lineinfo = b_00;
  f->sizelineinfo = uVar3;
  LoadBlock(S,b_00,(ulong)uVar3 << 2);
  uVar3 = LoadInt(S);
  sVar14 = (ulong)uVar3 * 0x10;
  pLVar9 = (LocVar *)luaM_realloc_(S->L,(void *)0x0,0,sVar14);
  f->locvars = pLVar9;
  f->sizelocvars = uVar3;
  auVar1 = _DAT_0011d020;
  if (uVar3 != 0) {
    lVar12 = (ulong)uVar3 - 1;
    auVar17._8_4_ = (int)lVar12;
    auVar17._0_8_ = lVar12;
    auVar17._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar11 = 0;
    auVar17 = auVar17 ^ _DAT_0011d020;
    auVar18 = _DAT_0011d010;
    do {
      auVar20 = auVar18 ^ auVar1;
      if ((bool)(~(auVar20._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar20._0_4_ ||
                  auVar17._4_4_ < auVar20._4_4_) & 1)) {
        *(undefined8 *)((long)&pLVar9->varname + uVar11) = 0;
      }
      if ((auVar20._12_4_ != auVar17._12_4_ || auVar20._8_4_ <= auVar17._8_4_) &&
          auVar20._12_4_ <= auVar17._12_4_) {
        *(undefined8 *)((long)&pLVar9[1].varname + uVar11) = 0;
      }
      lVar12 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 2;
      auVar18._8_8_ = lVar12 + 2;
      uVar11 = uVar11 + 0x20;
    } while ((sVar14 + 0x10 & 0xffffffffffffffe0) != uVar11);
    sVar13 = 0;
    do {
      pTVar8 = LoadString(S);
      *(TString **)((long)&f->locvars->varname + sVar13) = pTVar8;
      iVar2 = LoadInt(S);
      *(int *)((long)&f->locvars->startpc + sVar13) = iVar2;
      iVar2 = LoadInt(S);
      *(int *)((long)&f->locvars->endpc + sVar13) = iVar2;
      sVar13 = sVar13 + 0x10;
    } while (sVar14 != sVar13);
  }
  uVar3 = LoadInt(S);
  if (uVar3 != 0) {
    lVar12 = 0;
    do {
      pTVar8 = LoadString(S);
      *(TString **)((long)&f->upvalues->name + lVar12) = pTVar8;
      lVar12 = lVar12 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar12);
  }
  return;
}

Assistant:

static void LoadFunction(LoadState* S, Proto* f)
{
 f->linedefined=LoadInt(S);
 f->lastlinedefined=LoadInt(S);
 f->numparams=LoadByte(S);
 f->is_vararg=LoadByte(S);
 f->maxstacksize=LoadByte(S);
 LoadCode(S,f);
 LoadConstants(S,f);
 LoadUpvalues(S,f);
 LoadDebug(S,f);
}